

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

size_type __thiscall llvm::StringRef::find_first_of(StringRef *this,StringRef Chars,size_t From)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  size_type i;
  size_t Index;
  ulong uVar4;
  undefined1 auStack_68 [8];
  bitset<256UL> CharBits;
  StringRef Chars_local;
  
  CharBits.super__Base_bitset<4UL>._M_w[3] = (_WordT)Chars.Data;
  CharBits.super__Base_bitset<4UL>._M_w[1] = 0;
  CharBits.super__Base_bitset<4UL>._M_w[2] = 0;
  auStack_68 = (undefined1  [8])0x0;
  CharBits.super__Base_bitset<4UL>._M_w[0] = 0;
  for (Index = 0; Index != Chars.Length; Index = Index + 1) {
    bVar2 = operator[]((StringRef *)(CharBits.super__Base_bitset<4UL>._M_w + 3),Index);
    std::bitset<256UL>::set((bitset<256UL> *)auStack_68,(ulong)bVar2,true);
  }
  uVar1 = this->Length;
  if (uVar1 < From) {
    From = uVar1;
  }
  while ((uVar4 = 0xffffffffffffffff, uVar1 != From &&
         (bVar3 = std::bitset<256UL>::test
                            ((bitset<256UL> *)auStack_68,(ulong)(byte)this->Data[From]),
         uVar4 = From, !bVar3))) {
    From = From + 1;
  }
  return uVar4;
}

Assistant:

StringRef::size_type StringRef::find_first_of(StringRef Chars,
                                              size_t From) const {
  std::bitset<1 << CHAR_BIT> CharBits;
  for (size_type i = 0; i != Chars.size(); ++i)
    CharBits.set((unsigned char)Chars[i]);

  for (size_type i = std::min(From, Length), e = Length; i != e; ++i)
    if (CharBits.test((unsigned char)Data[i]))
      return i;
  return npos;
}